

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O0

int panicback(lua_State *L)

{
  __jmp_buf_tag *__env;
  Aux *b;
  lua_State *L_local;
  
  lua_checkstack(L,1);
  lua_getfield(L,-0xf4628,"_jmpbuf");
  __env = (__jmp_buf_tag *)lua_touserdata(L,-1);
  lua_settop(L,-2);
  runC((lua_State *)__env[1].__jmpbuf[1],L,(char *)__env[1].__jmpbuf[0]);
  longjmp(__env,1);
}

Assistant:

static int panicback (lua_State *L) {
  struct Aux *b;
  lua_checkstack(L, 1);  /* open space for 'Aux' struct */
  lua_getfield(L, LUA_REGISTRYINDEX, "_jmpbuf");  /* get 'Aux' struct */
  b = (struct Aux *)lua_touserdata(L, -1);
  lua_pop(L, 1);  /* remove 'Aux' struct */
  runC(b->L, L, b->paniccode);  /* run optional panic code */
  longjmp(b->jb, 1);
  return 1;  /* to avoid warnings */
}